

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

Vec3<float> __thiscall Imath_2_5::Vec3<float>::normalized(Vec3<float> *this)

{
  float *in_RSI;
  Vec3<float> *in_RDI;
  float fVar1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar2;
  float b;
  Vec3<float> VVar3;
  float l;
  
  fVar1 = length(in_RDI);
  b = 0.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    b = in_RSI[1] / fVar1;
    Vec3(in_RDI,*in_RSI / fVar1,b,in_RSI[2] / fVar1);
    uVar2 = extraout_XMM0_Qa_00;
  }
  else {
    Vec3(in_RDI,0.0);
    uVar2 = extraout_XMM0_Qa;
  }
  VVar3.z = b;
  VVar3.x = (float)(int)uVar2;
  VVar3.y = (float)(int)((ulong)uVar2 >> 0x20);
  return VVar3;
}

Assistant:

Vec3<T>
Vec3<T>::normalized () const
{
    T l = length();

    if (l == T (0))
	return Vec3 (T (0));

    return Vec3 (x / l, y / l, z / l);
}